

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_block_allocator.cpp
# Opt level: O1

void __thiscall
foxxll::disk_block_allocator::deallocation_error
          (disk_block_allocator *this,uint64_t block_pos,uint64_t block_size,iterator *pred,
          iterator *succ)

{
  _Rb_tree_header *p_Var1;
  char *pcVar2;
  Logger LStack_1a8;
  
  tlx::Logger::Logger(&LStack_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&LStack_1a8,"Error deallocating block at ",0x1c);
  std::ostream::_M_insert<unsigned_long>((ulong)&LStack_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&LStack_1a8," size ",6);
  std::ostream::_M_insert<unsigned_long>((ulong)&LStack_1a8);
  tlx::Logger::~Logger(&LStack_1a8);
  tlx::Logger::Logger(&LStack_1a8);
  pcVar2 = "pred!=succ";
  if (pred->_M_node == succ->_M_node) {
    pcVar2 = "pred==succ";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&LStack_1a8,pcVar2,10);
  tlx::Logger::~Logger(&LStack_1a8);
  p_Var1 = &(this->free_space_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)pred->_M_node == p_Var1) {
    tlx::Logger::Logger(&LStack_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&LStack_1a8,"pred==free_space_.end()",0x17);
  }
  else {
    if (pred->_M_node == (this->free_space_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
      tlx::Logger::Logger(&LStack_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&LStack_1a8,"pred==free_space_.begin()",0x19);
      tlx::Logger::~Logger(&LStack_1a8);
    }
    tlx::Logger::Logger(&LStack_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&LStack_1a8,"pred: begin=",0xc);
    std::ostream::_M_insert<unsigned_long>((ulong)&LStack_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&LStack_1a8," size=",6);
    std::ostream::_M_insert<unsigned_long>((ulong)&LStack_1a8);
  }
  tlx::Logger::~Logger(&LStack_1a8);
  if ((_Rb_tree_header *)succ->_M_node == p_Var1) {
    tlx::Logger::Logger(&LStack_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&LStack_1a8,"succ==free_space_.end()",0x17);
  }
  else {
    if (succ->_M_node == (this->free_space_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
      tlx::Logger::Logger(&LStack_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&LStack_1a8,"succ==free_space_.begin()",0x19);
      tlx::Logger::~Logger(&LStack_1a8);
    }
    tlx::Logger::Logger(&LStack_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&LStack_1a8,"succ: begin=",0xc);
    std::ostream::_M_insert<unsigned_long>((ulong)&LStack_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&LStack_1a8," size=",6);
    std::ostream::_M_insert<unsigned_long>((ulong)&LStack_1a8);
  }
  tlx::Logger::~Logger(&LStack_1a8);
  dump(this);
  return;
}

Assistant:

void disk_block_allocator::deallocation_error(
    uint64_t block_pos, uint64_t block_size,
    const space_map_type::iterator& pred,
    const space_map_type::iterator& succ) const
{
    TLX_LOG1 << "Error deallocating block at " << block_pos << " size " << block_size;
    TLX_LOG1 << ((pred == succ) ? "pred==succ" : "pred!=succ");
    if (pred == free_space_.end()) {
        TLX_LOG1 << "pred==free_space_.end()";
    }
    else {
        if (pred == free_space_.begin())
            TLX_LOG1 << "pred==free_space_.begin()";
        TLX_LOG1 << "pred: begin=" << pred->first << " size=" << pred->second;
    }
    if (succ == free_space_.end()) {
        TLX_LOG1 << "succ==free_space_.end()";
    }
    else {
        if (succ == free_space_.begin())
            TLX_LOG1 << "succ==free_space_.begin()";
        TLX_LOG1 << "succ: begin=" << succ->first << " size=" << succ->second;
    }
    dump();
}